

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O3

void __thiscall MultiANN::UpdateAnnArray(MultiANN *this)

{
  uint uVar1;
  int n2;
  ANNpointArray points;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ANN *pAVar6;
  ulong uVar7;
  int local_38;
  
  uVar1 = this->size;
  if ((uVar1 & 0xf) == 0 && 0 < (int)uVar1) {
    iVar3 = 0;
    uVar7 = 0x1f;
    do {
      if (this->AnnArray[uVar7 - 1] != (ANN *)0x0) {
        iVar3 = ANN::LastNode(this->AnnArray[uVar7 - 1]);
      }
      uVar7 = uVar7 - 1;
    } while (4 < uVar7);
    if (iVar3 + 1 != this->size) {
      lVar5 = 0xb;
      do {
        lVar4 = lVar5;
        pAVar6 = this->AnnArray[lVar4 + -7];
        if (pAVar6 == (ANN *)0x0) break;
        ANN::~ANN(pAVar6);
        operator_delete(pAVar6);
        this->AnnArray[lVar4 + -7] = (ANN *)0x0;
        lVar5 = lVar4 + 1;
      } while (lVar4 - 8U < 0x1e);
      local_38 = (int)lVar4 + -7;
      iVar3 = 0;
      lVar5 = lVar4;
      if (lVar4 - 8U < 0x1e && uVar1 != 0x10) {
        do {
          if (this->AnnArray[lVar5 + -7] != (ANN *)0x0) {
            iVar3 = ANN::LastNode(this->AnnArray[lVar5 + -7]);
            iVar3 = iVar3 + 1;
            break;
          }
          uVar7 = lVar5 - 7;
          lVar5 = lVar5 + 1;
        } while (uVar7 < 0x1e);
      }
      pAVar6 = (ANN *)operator_new(0x40);
      points = this->points_coor;
      n2 = this->size;
      dVar2 = exp2((double)local_38);
      ANN::ANN(pAVar6,points,iVar3,n2,(int)dVar2,this->dimension,this->topology,this->scaling,
               this->NumNeighbors);
      this->AnnArray[lVar4 + -7] = pAVar6;
    }
  }
  return;
}

Assistant:

void MultiANN::UpdateAnnArray()  // updates the arrays of data points
{
    int j, k, num;
    int n, n_last;
    bool done;

    num = size;
    n_last = 0;  // Just to make warnings go away

    if ((num > 0) && (num % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
                      0)) {  // Check if it is time to update the ANNs

        for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
            if (AnnArray[k])
                n_last = AnnArray[k]->LastNode();  // Make sure update has not
                                                   // been performed
        }
        n_last++;

        if (n_last != size) {  // If equal, then update already performed

            k = ANN_STARTING_INDEX - 1;
            done = false;
            while ((k <= ANN_MAXIMUM_INDEX) && (!done)) {
                k++;
                if (!AnnArray[k]) {  // If there is no tree, then make one
                    done = true;
                } else {
                    delete (AnnArray[k]);  // Blow this one away; these nodes
                                           // are moved up
                    AnnArray[k] = NULL;
                }
            }

            if ((num == ((int)pow((double)2, ANN_STARTING_INDEX))))  // k should
                                                                     // be the
                                                                     // location
                                                                     // for
                                                                     // making
                                                                     // the new
                                                                     // ANN tree
                n = 0;  // Need to find the starting node in G for the new ANN
                        // tree
            else {
                j = k;
                done = false;
                while ((j <= ANN_MAXIMUM_INDEX) && (!done)) {
                    if (AnnArray[j]) {
                        n = AnnArray[j]->LastNode();
                        n++;
                        done = true;
                    }
                    j++;
                }
            }

            if (!done) n = 0;

            AnnArray[k] =
                new ANN(points_coor, n, size, (int)pow((double)2, k), dimension,
                        topology, scaling,
                        NumNeighbors);  // Finally, make the new ANN tree

            // cout << "New ANN Tree:  k: " << k << " num: " << num << "\n";
            // for (j = ANN_MAXIMUM_INDEX; j >= ANN_STARTING_INDEX; j--) {
            // 	cout << (AnnArray[j] ? "X" : ".");
            //}
            // cout << "\n";
        }
    }
}